

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O0

void __thiscall LogFile::put_write_string(LogFile *this,char *buff)

{
  char *local_18;
  char *buff_local;
  LogFile *this_local;
  
  local_18 = buff;
  buff_local = (char *)this;
  pthread_mutex_lock((pthread_mutex_t *)&this->put_Mutex);
  std::queue<char_*,_std::deque<char_*,_std::allocator<char_*>_>_>::push
            (&this->Wait_WriteTask,&local_18);
  pthread_cond_broadcast((pthread_cond_t *)&this->Swap_Cond);
  pthread_mutex_unlock((pthread_mutex_t *)&this->put_Mutex);
  return;
}

Assistant:

void LogFile::put_write_string(char* buff)
{
    pthread_mutex_lock(&put_Mutex);
    Wait_WriteTask.push(buff);
    pthread_cond_broadcast(&Swap_Cond);
    pthread_mutex_unlock(&put_Mutex);
}